

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::LargeHeapBlock::ScanNewImplicitRoots(LargeHeapBlock *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  LargeObjectHeader *this_00;
  size_t byteCount;
  uint index;
  LargeObjectHeader *obj;
  
  if (recycler->enableScanImplicitRoots == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x46c,"(recycler->enableScanImplicitRoots)",
                       "recycler->enableScanImplicitRoots");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  index = 0;
  do {
    if (this->allocCount <= index) {
      return;
    }
    this_00 = GetHeaderByIndex(this,index);
    if ((this_00 != (LargeObjectHeader *)0x0) &&
       (bVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie),
       (bVar3 & 8) != 0)) {
      obj = this_00 + 1;
      bVar2 = HeapBlockMap64::TestAndSetMark(&recycler->heapBlockMap,obj);
      if (!bVar2) {
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::BeginDumpObject(recycler->objectGraphDumper,L"Implicit Root");
          if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
            RecyclerObjectGraphDumper::DumpObjectReference(recycler->objectGraphDumper,obj,false);
            if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
              RecyclerObjectGraphDumper::EndDumpObject(recycler->objectGraphDumper);
            }
          }
        }
        bVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
        if ((bVar3 & 0x20) == 0) {
          if ((this->pageHeapData == (PageHeapData *)0x0) ||
             (this->pageHeapData->pageHeapMode == PageHeapModeOff)) {
            byteCount = this_00->objectSize;
          }
          else {
            byteCount = this_00->objectSize & 0xfffffffffffffff8;
            if (byteCount == 0) goto LAB_0065d37e;
          }
          Recycler::ScanObjectInlineInterior(recycler,(void **)obj,byteCount);
        }
      }
    }
LAB_0065d37e:
    index = index + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::ScanNewImplicitRoots(Recycler * recycler)
{
    Assert(recycler->enableScanImplicitRoots);

    uint objectIndex = 0;
    HeapBlockMap& heapBlockMap = recycler->heapBlockMap;
    while (objectIndex < allocCount)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        objectIndex++;

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        // check whether the object is an implicit root
        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & ImplicitRootBit) == 0)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        bool marked = heapBlockMap.TestAndSetMark(objectAddress);
        if (!marked)
        {
            DUMP_IMPLICIT_ROOT(recycler, objectAddress);

            // check whether the object is a leaf and doesn't need to be scanned
            if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & LeafBit) != 0)
            {
                continue;
            }

#ifdef RECYCLER_PAGE_HEAP
            if (this->InPageHeapMode())
            {
                size_t objectSize = header->objectSize;
                // trim off the trailing part which is not a pointer
                objectSize = HeapInfo::RoundObjectSize(objectSize);
                if (objectSize > 0) // otherwise the object total size is less than a pointer size
                {
                    recycler->ScanObjectInlineInterior((void **)objectAddress, objectSize);
                }
            }
            else
#endif
            {
                // TODO: Assume scan interior
                recycler->ScanObjectInlineInterior((void **)objectAddress, header->objectSize);
            }
        }
    }
}